

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fragment_uri.h
# Opt level: O1

HalfRange ktx::parseHalfRange(string_view key,string_view str)

{
  int iVar1;
  char **ppcVar2;
  void *pvVar3;
  int *piVar4;
  ulong uVar5;
  long lVar6;
  long *plVar7;
  invalid_argument *this;
  char *__s;
  ulong uVar8;
  ulong __n_00;
  ulong uVar9;
  char *pcVar10;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  size_type __n;
  long lVar11;
  string_view fmt;
  undefined1 auVar12 [12];
  format_args args;
  char *local_c8;
  char **local_a8 [2];
  char *local_98 [2];
  char **local_88;
  size_t local_80;
  char *local_78;
  ulong local_70;
  undefined8 local_68;
  string local_50;
  
  __s = str._M_str;
  __n_00 = str._M_len;
  if (__n_00 == 0) {
    uVar8 = 0xffffffffffffffff;
  }
  else {
    pvVar3 = memchr(__s,0x2c,__n_00);
    uVar8 = -(ulong)(pvVar3 == (void *)0x0) | (long)pvVar3 - (long)__s;
  }
  uVar9 = uVar8;
  if (__n_00 < uVar8) {
    uVar9 = __n_00;
  }
  if (uVar8 == 0xffffffffffffffff) {
    lVar11 = 0;
    pcVar10 = "";
    uVar9 = __n_00;
LAB_001952c1:
    uVar8 = 0xffffffff00000000;
    local_c8 = __s;
    if (uVar9 != 0) {
      local_a8[0] = local_98;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,__s,__s + uVar9);
      ppcVar2 = local_a8[0];
      piVar4 = __errno_location();
      iVar1 = *piVar4;
      *piVar4 = 0;
      uVar5 = strtol((char *)ppcVar2,(char **)&local_88,10);
      if (local_88 == ppcVar2) goto LAB_00195470;
      if ((0xfffffffeffffffff < uVar5 - 0x80000000) && (*piVar4 != 0x22)) {
        if (*piVar4 == 0) {
          *piVar4 = iVar1;
        }
        uVar5 = uVar5 & 0xffffffff;
        goto LAB_00195364;
      }
      goto LAB_0019547c;
    }
    uVar5 = 0;
LAB_00195364:
    if ((uVar9 != 0) && (local_a8[0] != local_98)) {
      operator_delete(local_a8[0],(ulong)(local_98[0] + 1));
    }
    if (lVar11 == 0) {
LAB_0019541d:
      if ((lVar11 != 0) && (local_88 != &local_78)) {
        operator_delete(local_88,(ulong)(local_78 + 1));
      }
      return (HalfRange)(uVar8 | uVar5);
    }
    local_88 = &local_78;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,pcVar10,pcVar10 + lVar11);
    ppcVar2 = local_88;
    piVar4 = __errno_location();
    iVar1 = *piVar4;
    *piVar4 = 0;
    lVar6 = strtol((char *)ppcVar2,(char **)&local_50,10);
    if ((char **)local_50._M_dataplus._M_p != ppcVar2) {
      if ((0xfffffffeffffffff < lVar6 - 0x80000000U) && (*piVar4 != 0x22)) {
        if (*piVar4 == 0) {
          *piVar4 = iVar1;
        }
        uVar8 = (lVar6 << 0x20) + 0x100000000;
        goto LAB_0019541d;
      }
      goto LAB_00195494;
    }
  }
  else {
    lVar6 = uVar8 + 1;
    if (uVar8 < __n_00) {
      lVar11 = __n_00 - lVar6;
      pcVar10 = __s + lVar6;
      goto LAB_001952c1;
    }
    std::__throw_out_of_range_fmt
              ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",lVar6,
               __n_00);
LAB_00195470:
    std::__throw_invalid_argument("stoi");
LAB_0019547c:
    std::__throw_out_of_range("stoi");
  }
  std::__throw_invalid_argument("stoi");
LAB_00195494:
  auVar12 = std::__throw_out_of_range("stoi");
  if (auVar12._8_4_ != 1) {
    _Unwind_Resume(auVar12._0_8_);
  }
  plVar7 = (long *)__cxa_begin_catch(auVar12._0_8_);
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  local_68 = (**(code **)(*plVar7 + 0x10))(plVar7);
  local_78 = local_c8;
  fmt.size_ = 0xcdd;
  fmt.data_ = (char *)0x1d;
  args.field_1.args_ = in_R9.args_;
  args.desc_ = (unsigned_long_long)&local_88;
  local_88 = (char **)key._M_str;
  local_80 = key._M_len;
  local_70 = __n_00;
  ::fmt::v10::vformat_abi_cxx11_(&local_50,(v10 *)"Invalid key-value \"{}={}\": {}",fmt,args);
  std::invalid_argument::invalid_argument(this,(string *)&local_50);
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

[[nodiscard]] inline SelectorRange::HalfRange parseHalfRange(std::string_view key, std::string_view str) {
    const auto indexComma = str.find(',');
    const auto strBegin = indexComma == std::string_view::npos ? str : str.substr(0, indexComma);
    const auto strEnd = indexComma == std::string_view::npos ? "" : str.substr(indexComma + 1);

    try {
        const auto begin = strBegin.empty() ? 0u : static_cast<uint32_t>(std::stoi(std::string(strBegin)));
        const auto end = strEnd.empty() ? RangeEnd : static_cast<uint32_t>(std::stoi(std::string(strEnd))) + 1u;
        return {begin, end};
    } catch (const std::exception& ex) {
        throw std::invalid_argument(fmt::format("Invalid key-value \"{}={}\": {}", key, str, ex.what()));
    }
}